

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

LPWSTR Internal_i64tow(INT64 value,LPWSTR string,int radix,BOOL isI64)

{
  WCHAR WVar1;
  short sVar2;
  int iVar3;
  int local_50;
  int iStack_4c;
  WCHAR tempCh;
  int end;
  int start;
  LPWSTR stringPtr;
  UINT64 uval;
  int r;
  int n;
  int length;
  BOOL isI64_local;
  int radix_local;
  LPWSTR string_local;
  INT64 value_local;
  
  r = 0;
  iStack_4c = 0;
  if ((radix < 2) || (0x24 < radix)) {
    fprintf(_stderr,"] %s %s:%d","Internal_i64tow",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
            ,0x65);
    fprintf(_stderr,"Invalid radix, radix must be between 2 and 36\n");
    SetLastError(0x57);
  }
  else {
    stringPtr = (LPWSTR)value;
    if (isI64 == 0) {
      stringPtr = (LPWSTR)(value & 0xffffffff);
    }
    if ((radix == 10) && (value < 0)) {
      stringPtr = (LPWSTR)-value;
    }
    _end = string;
    if (stringPtr == (LPWSTR)0x0) {
      r = 1;
      _end = string + 1;
      *string = L'0';
    }
    else {
      while (stringPtr != (LPWSTR)0x0) {
        r = r + 1;
        iVar3 = (int)stringPtr - (int)((ulong)stringPtr / (ulong)(long)radix) * radix;
        stringPtr = (LPWSTR)((ulong)stringPtr / (ulong)(long)radix);
        sVar2 = (short)iVar3;
        if (iVar3 < 10) {
          *_end = sVar2 + L'0';
        }
        else {
          *_end = sVar2 + L'W';
        }
        _end = _end + 1;
      }
    }
    if ((radix == 10) && (value < 0)) {
      *_end = L'-';
      r = r + 1;
      _end = _end + 1;
    }
    *_end = L'\0';
    for (; local_50 = r + -1, iStack_4c < local_50; iStack_4c = iStack_4c + 1) {
      WVar1 = string[iStack_4c];
      string[iStack_4c] = string[local_50];
      string[local_50] = WVar1;
      r = local_50;
    }
  }
  return string;
}

Assistant:

LPWSTR Internal_i64tow(INT64 value, LPWSTR string, int radix, BOOL isI64)
{
    int length = 0;
    int n;
    int r;
    UINT64 uval = value;
    LPWSTR stringPtr = string;
    int start = 0;
    int end;
    WCHAR tempCh;

    if (radix < 2 || radix > 36)
    {
        ASSERT( "Invalid radix, radix must be between 2 and 36\n" );
        SetLastError(ERROR_INVALID_PARAMETER);
        return string;
    }
    if (FALSE == isI64)
    {
        uval = (ULONG) uval;
    }
    if (10 == radix && value < 0)
    {
        uval = value * -1;
    }
    if(0 == uval)
    {
        ++length;
        *stringPtr++ = '0';
    }
    else while (uval > 0)
    {
        ++length;
        n = uval / radix;
        r = uval - (n * radix);
        uval /= radix;
        if (r > 9)
        {
            *stringPtr++ = r + 87;
        }
        else
        {
            *stringPtr++ = r + 48;
        }
    }
    if (10 == radix && value < 0)
    {
        *stringPtr++ = '-';
        ++length;
    }
    *stringPtr = 0; /* end the string */

    /* reverse the string */
    end = length - 1;
    while (start < end)
    {
        tempCh = string[start];
        string[start] = string[end];
        string[end] = tempCh;
        ++start;
        --end;
    }

    return string;
}